

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_personality.c
# Opt level: O0

void saveLandingPad(_Unwind_Context *context,_Unwind_Exception *ucb,objc_exception *ex,int selector,
                   dw_eh_ptr_t landingPad)

{
  dw_eh_ptr_t landingPad_local;
  int selector_local;
  objc_exception *ex_local;
  _Unwind_Exception *ucb_local;
  _Unwind_Context *context_local;
  
  if (ex != (objc_exception *)0x0) {
    ex->handlerSwitchValue = selector;
    ex->landingPad = landingPad;
  }
  return;
}

Assistant:

static void saveLandingPad(struct _Unwind_Context *context,
                           struct _Unwind_Exception *ucb,
                           struct objc_exception *ex,
                           int selector,
                           dw_eh_ptr_t landingPad)
{
#if defined(__arm__) && !defined(__ARM_DWARF_EH__)
	// On ARM, we store the saved exception in the generic part of the structure
	ucb->barrier_cache.sp = _Unwind_GetGR(context, 13);
	ucb->barrier_cache.bitpattern[1] = (uint32_t)selector;
	ucb->barrier_cache.bitpattern[3] = (uint32_t)landingPad;
#else
	// Cache the results for the phase 2 unwind, if we found a handler
	// and this is not a foreign exception.  We can't cache foreign exceptions
	// because we don't know their structure (although we could cache C++
	// exceptions...)
	if (ex)
	{
		ex->handlerSwitchValue = selector;
		ex->landingPad = landingPad;
	}
#endif
}